

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-bitmap.h
# Opt level: O2

int bitmap_bit_p(const_bitmap_t bm,size_t nb)

{
  size_t sVar1;
  bitmap_el_t *pbVar2;
  uint uVar3;
  
  sVar1 = VARR_bitmap_el_tlength(bm);
  pbVar2 = VARR_bitmap_el_taddr(bm);
  uVar3 = 0;
  if (nb < sVar1 << 6) {
    uVar3 = (uint)(pbVar2[nb >> 6] >> (nb & 0x3f)) & 1;
  }
  return uVar3;
}

Assistant:

static inline int bitmap_bit_p (const_bitmap_t bm, size_t nb) {
  size_t nw, sh, len = VARR_LENGTH (bitmap_el_t, bm);
  bitmap_el_t *addr = VARR_ADDR (bitmap_el_t, bm);

  if (nb >= BITMAP_WORD_BITS * len) return 0;
  nw = nb / BITMAP_WORD_BITS;
  sh = nb % BITMAP_WORD_BITS;
  return (addr[nw] >> sh) & 1;
}